

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *pNVar1;
  
  pNVar1 = t->node + (int)(~(uint)(-1L << (t->lsizenode & 0x3f)) & (key->tsv).hash);
  while (((pNVar1->i_key).nk.tt != 4 || ((pNVar1->i_key).nk.value.gc != (GCObject *)key))) {
    pNVar1 = *(Node **)((long)&pNVar1->i_key + 0x10);
    if (pNVar1 == (Node *)0x0) {
      return &luaO_nilobject_;
    }
  }
  return &pNVar1->i_val;
}

Assistant:

static const TValue*luaH_getstr(Table*t,TString*key){
Node*n=hashstr(t,key);
do{
if(ttisstring(gkey(n))&&rawtsvalue(gkey(n))==key)
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}